

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeMeshless::ChNodeMeshless(ChNodeMeshless *this,void **vtt,ChNodeMeshless *other)

{
  double dVar1;
  ChLoadableUVW CVar2;
  ChCollisionModel *pCVar3;
  ChCollisionModelBullet *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  ChNodeXYZ::ChNodeXYZ(&this->super_ChNodeXYZ,vtt + 1,&other->super_ChNodeXYZ);
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined ***)&(this->super_ChNodeXYZ).field_0x50 = &PTR__ChContactable_1vars_00b37c10;
  *(undefined ***)&this->field_0x68 = &PTR__ChContactable_1vars_00b37cb8;
  CVar2 = (ChLoadableUVW)*vtt;
  (this->super_ChNodeXYZ).super_ChLoadableUVW = CVar2;
  *(void **)((long)(this->super_ChNodeXYZ).pos.m_data + *(long *)((long)CVar2 + -0x80) + -8) =
       vtt[6];
  *(void **)((long)(this->super_ChNodeXYZ).pos.m_data +
            *(long *)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + -0x78) + -8) = vtt[7];
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x50 = 0xb4f3f8;
  *(undefined8 *)&this->field_0x68 = 0xb4f4a0;
  (this->pos_ref).m_data[0] = 0.0;
  (this->pos_ref).m_data[1] = 0.0;
  (this->pos_ref).m_data[2] = 0.0;
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->UserForce).m_data[0] = 0.0;
  (this->UserForce).m_data[1] = 0.0;
  (this->UserForce).m_data[2] = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])
            (this_00,&(this->super_ChNodeXYZ).field_0x50);
  pCVar3 = this->collision_model;
  local_48 = (other->container->matsurface).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = (other->container->matsurface).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  (*pCVar3->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar3,&local_48);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (other != this) {
    (this->pos_ref).m_data[0] = (other->pos_ref).m_data[0];
    (this->pos_ref).m_data[1] = (other->pos_ref).m_data[1];
    (this->pos_ref).m_data[2] = (other->pos_ref).m_data[2];
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
  }
  dVar1 = other->h_rad;
  this->h_rad = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1 * 0.5 - this->coll_rad;
  auVar4 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
  collision::ChCollisionModelBullet::SetSphereRadius
            ((ChCollisionModelBullet *)this->collision_model,this->coll_rad,auVar4._0_8_);
  dVar1 = other->coll_rad;
  this->coll_rad = dVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->h_rad * 0.5 - dVar1;
  auVar4 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar5);
  collision::ChCollisionModelBullet::SetSphereRadius
            ((ChCollisionModelBullet *)this->collision_model,dVar1,auVar4._0_8_);
  (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
  (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
  this->volume = other->volume;
  this->density = other->density;
  this->hardening = other->hardening;
  dVar1 = (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  dVar1 = (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
  dVar1 = (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (other->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (this->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
  dVar1 = (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  dVar1 = (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
  dVar1 = (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (other->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (this->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
  dVar1 = (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  dVar1 = (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
  dVar1 = (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (other->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (this->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
  dVar1 = (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  dVar1 = (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar1;
  dVar1 = (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (other->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (this->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
  this->container = other->container;
  ChVariablesNode::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChNodeMeshless::ChNodeMeshless(const ChNodeMeshless& other) : ChNodeXYZ(other) {
    collision_model = new ChCollisionModelBullet;
    collision_model->SetContactable(this);
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);

    pos_ref = other.pos_ref;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;
    hardening = other.hardening;

    t_strain = other.t_strain;
    p_strain = other.p_strain;
    e_strain = other.e_strain;
    e_stress = other.e_stress;

    container = other.container;

    variables = other.variables;
}